

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.h
# Opt level: O3

void bloomfilter::applyBlock(uint32_t *tmp,int block,int len,uint64_t *data)

{
  ulong uVar1;
  
  if (0 < len) {
    uVar1 = 0;
    do {
      data[tmp[(long)(block << 0xf) + uVar1] >> 6] =
           data[tmp[(long)(block << 0xf) + uVar1] >> 6] |
           1L << ((byte)tmp[(long)(block << 0xf) + uVar1] & 0x3f);
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
  }
  return;
}

Assistant:

void applyBlock(uint32_t *tmp, int block, int len, uint64_t *data) {
  for (int i = 0; i < len; i++) {
    uint32_t index = tmp[(block << blockShift) + i];
    data[index >> 6] |= getBit(index);
  }
}